

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

ctmbstr GetColorName(ctmbstr code,Bool use_css_colors)

{
  int iVar1;
  uint local_20;
  uint i;
  Bool use_css_colors_local;
  ctmbstr code_local;
  
  local_20 = 0;
  while (colors[local_20].name != (ctmbstr)0x0) {
    iVar1 = prvTidytmbstrcasecmp(code,colors[local_20].hex);
    if (iVar1 == 0) {
      return colors[local_20].name;
    }
    local_20 = local_20 + 1;
  }
  if (use_css_colors != no) {
    local_20 = 0;
    while (extended_colors[local_20].name != (ctmbstr)0x0) {
      iVar1 = prvTidytmbstrcasecmp(code,extended_colors[local_20].hex);
      if (iVar1 == 0) {
        return extended_colors[local_20].name;
      }
      local_20 = local_20 + 1;
    }
  }
  return (ctmbstr)0x0;
}

Assistant:

static ctmbstr GetColorName(ctmbstr code, Bool use_css_colors)
{
    uint i;

    for (i = 0; colors[i].name; ++i)
        if (TY_(tmbstrcasecmp)(code, colors[i].hex) == 0)
            return colors[i].name;

    if (use_css_colors)
        for (i = 0; extended_colors[i].name; ++i)
            if (TY_(tmbstrcasecmp)(code, extended_colors[i].hex) == 0)
                return extended_colors[i].name;

    return NULL;
}